

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::commands::lexer(commands *this)

{
  token *ptVar1;
  string local_38;
  
  ptVar1 = this->t_cmd;
  if (ptVar1 != (token *)0x0) {
    token::~token(ptVar1);
  }
  operator_delete(ptVar1,0x90);
  this->t_par = (token *)0x0;
  value_abi_cxx11_(&local_38,this);
  ptVar1 = libchars::lexer(&local_38);
  this->t_cmd = ptVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void commands::lexer()
    {
        delete t_cmd;
        t_par = NULL;
        t_cmd = libchars::lexer(value());
    }